

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_math_random(jit_State *J,RecordFFData *rd)

{
  IRRef1 IVar1;
  IRRef1 IVar2;
  TRef TVar3;
  TRef TVar4;
  TRef TVar5;
  GCobj *o;
  jit_State *in_RSI;
  jit_State *in_RDI;
  TRef tr2;
  TRef tr1;
  TRef one;
  TRef tr;
  GCudata *ud;
  undefined4 in_stack_ffffffffffffff38;
  TRef in_stack_ffffffffffffff3c;
  jit_State *J_00;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  IRType in_stack_ffffffffffffff54;
  
  o = (GCobj *)(ulong)(in_RDI->fn->c).upvalue[0].u32.lo;
  lj_ir_kgc(in_RSI,o,in_stack_ffffffffffffff54);
  J_00 = in_RDI;
  TVar3 = lj_ir_kptr_(in_RSI,(IROp)((ulong)o >> 0x20),
                      (void *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  TVar3 = lj_ir_call(J_00,IRCALL_lj_math_random_step,(ulong)TVar3);
  IVar1 = (IRRef1)TVar3;
  TVar3 = lj_ir_knum_u64(J_00,CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  IVar2 = (IRRef1)TVar3;
  (in_RDI->fold).ins.field_0.ot = 0x290e;
  (in_RDI->fold).ins.field_0.op1 = IVar1;
  (in_RDI->fold).ins.field_0.op2 = IVar2;
  TVar3 = lj_opt_fold((jit_State *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  if (*in_RDI->base != 0) {
    TVar4 = lj_ir_tonum(J_00,in_stack_ffffffffffffff3c);
    IVar1 = (IRRef1)TVar3;
    if (in_RDI->base[1] == 0) {
      (in_RDI->fold).ins.field_0.ot = 0x2a0e;
      (in_RDI->fold).ins.field_0.op1 = IVar1;
      (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar4;
      TVar3 = lj_opt_fold((jit_State *)CONCAT44(TVar4,in_stack_ffffffffffffff48));
      (in_RDI->fold).ins.field_0.ot = 0x340e;
      (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar3;
      (in_RDI->fold).ins.field_0.op2 = 0;
      TVar3 = lj_opt_fold((jit_State *)CONCAT44(TVar4,in_stack_ffffffffffffff48));
      (in_RDI->fold).ins.field_0.ot = 0x280e;
      (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar3;
      (in_RDI->fold).ins.field_0.op2 = IVar2;
      TVar3 = lj_opt_fold((jit_State *)CONCAT44(TVar4,in_stack_ffffffffffffff48));
    }
    else {
      TVar3 = lj_ir_tonum(J_00,in_stack_ffffffffffffff3c);
      (in_RDI->fold).ins.field_0.ot = 0x290e;
      (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar3;
      (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar4;
      TVar3 = lj_opt_fold((jit_State *)CONCAT44(TVar4,TVar3));
      (in_RDI->fold).ins.field_0.ot = 0x280e;
      (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar3;
      (in_RDI->fold).ins.field_0.op2 = IVar2;
      TVar3 = lj_opt_fold((jit_State *)CONCAT44(TVar4,TVar3));
      (in_RDI->fold).ins.field_0.ot = 0x2a0e;
      (in_RDI->fold).ins.field_0.op1 = IVar1;
      (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar3;
      TVar5 = lj_opt_fold((jit_State *)CONCAT44(TVar4,TVar3));
      (in_RDI->fold).ins.field_0.ot = 0x340e;
      (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar5;
      (in_RDI->fold).ins.field_0.op2 = 0;
      TVar5 = lj_opt_fold((jit_State *)CONCAT44(TVar4,TVar3));
      (in_RDI->fold).ins.field_0.ot = 0x280e;
      (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar5;
      (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar4;
      TVar3 = lj_opt_fold((jit_State *)CONCAT44(TVar4,TVar3));
    }
  }
  *in_RDI->base = TVar3;
  return;
}

Assistant:

static void LJ_FASTCALL recff_math_random(jit_State *J, RecordFFData *rd)
{
  GCudata *ud = udataV(&J->fn->c.upvalue[0]);
  TRef tr, one;
  lj_ir_kgc(J, obj2gco(ud), IRT_UDATA);  /* Prevent collection. */
  tr = lj_ir_call(J, IRCALL_lj_math_random_step, lj_ir_kptr(J, uddata(ud)));
  one = lj_ir_knum_one(J);
  tr = emitir(IRTN(IR_SUB), tr, one);
  if (J->base[0]) {
    TRef tr1 = lj_ir_tonum(J, J->base[0]);
    if (J->base[1]) {  /* d = floor(d*(r2-r1+1.0)) + r1 */
      TRef tr2 = lj_ir_tonum(J, J->base[1]);
      tr2 = emitir(IRTN(IR_SUB), tr2, tr1);
      tr2 = emitir(IRTN(IR_ADD), tr2, one);
      tr = emitir(IRTN(IR_MUL), tr, tr2);
      tr = emitir(IRTN(IR_FPMATH), tr, IRFPM_FLOOR);
      tr = emitir(IRTN(IR_ADD), tr, tr1);
    } else {  /* d = floor(d*r1) + 1.0 */
      tr = emitir(IRTN(IR_MUL), tr, tr1);
      tr = emitir(IRTN(IR_FPMATH), tr, IRFPM_FLOOR);
      tr = emitir(IRTN(IR_ADD), tr, one);
    }
  }
  J->base[0] = tr;
  UNUSED(rd);
}